

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

PropertyIndex __thiscall
Js::SimpleTypeHandler<3UL>::GetPropertyIndex
          (SimpleTypeHandler<3UL> *this,PropertyRecord *propertyRecord)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  PropertyIndex PVar4;
  uint in_EAX;
  uint uVar5;
  
  iVar1 = this->propertyCount;
  bVar2 = 0 < iVar1;
  if (0 < iVar1) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyRecord->pid) {
      bVar2 = true;
      in_EAX = 0;
    }
    else {
      uVar3 = 1;
      do {
        in_EAX = uVar3;
        uVar5 = in_EAX & 0xffff;
        bVar2 = (int)uVar5 < iVar1;
        if (iVar1 <= (int)uVar5) break;
        uVar3 = uVar5 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar5 << 4)) + 8) !=
               propertyRecord->pid);
    }
  }
  PVar4 = (PropertyIndex)in_EAX;
  if ((!bVar2) ||
     ((*(byte *)((long)&this->descriptors[0].field_1 + (ulong)((in_EAX & 0xffff) << 4)) & 8) != 0))
  {
    PVar4 = 0xffff;
  }
  return PVar4;
}

Assistant:

PropertyIndex SimpleTypeHandler<size>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            return (PropertyIndex)index;
        }
        return Constants::NoSlot;
    }